

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spfgmr_serial.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint onoff;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  N_Vector p_Var12;
  N_Vector p_Var13;
  long lVar14;
  SUNLinearSolver p_Var15;
  long lVar16;
  char *__s;
  double tol;
  UserData ProbData;
  SUNContext sunctx;
  long local_78;
  long local_70;
  N_Vector local_68;
  N_Vector local_60;
  long local_58;
  undefined8 local_50;
  SUNLinearSolver local_48;
  N_Vector local_40;
  N_Vector local_38;
  
  iVar1 = SUNContext_Create(0,&local_50);
  if (iVar1 != 0) {
    puts("ERROR: SUNContext_Create failed");
    return -1;
  }
  if (argc < 6) {
    puts("ERROR: FIVE (5) Inputs required:");
    puts("  Problem size should be >0");
    puts("  Gram-Schmidt orthogonalization type should be 1 or 2");
    puts("  Maximum Krylov subspace dimension should be >0");
    puts("  Solver tolerance should be >0");
    __s = "  timing output flag should be 0 or 1 ";
  }
  else {
    problem_size = atol(argv[1]);
    local_78 = problem_size;
    if (problem_size < 1) {
      __s = "ERROR: Problem size must be a positive integer";
    }
    else {
      uVar2 = atoi(argv[2]);
      if (uVar2 - 3 < 0xfffffffe) {
        __s = "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2";
      }
      else {
        uVar3 = atoi(argv[3]);
        if ((int)uVar3 < 1) {
          __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
        }
        else {
          tol = atof(argv[4]);
          if (0.0 < tol) {
            onoff = atoi(argv[5]);
            SetTiming(onoff);
            puts("\nSPFGMR linear solver test:");
            printf("  problem size = %ld\n",local_78);
            printf("  Gram-Schmidt orthogonalization type = %i\n",(ulong)uVar2);
            printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar3);
            printf("  Solver Tolerance = %g\n",tol);
            printf("  timing output flag = %i\n\n",(ulong)onoff);
            p_Var12 = (N_Vector)N_VNew_Serial(local_78,local_50);
            if (p_Var12 == (N_Vector)0x0) {
              main_cold_6();
              return 1;
            }
            local_58 = N_VNew_Serial(local_78,local_50);
            if (local_58 == 0) {
              main_cold_5();
              return 1;
            }
            p_Var13 = (N_Vector)N_VNew_Serial(local_78,local_50);
            if (p_Var13 == (N_Vector)0x0) {
              main_cold_4();
              return 1;
            }
            local_70 = N_VNew_Serial(local_78,local_50);
            if (local_70 != 0) {
              local_68 = (N_Vector)N_VNew_Serial(local_78,local_50);
              if (local_68 == (N_Vector)0x0) {
                main_cold_2();
                return 1;
              }
              local_60 = (N_Vector)N_VNew_Serial(local_78,local_50);
              if (local_60 != (N_Vector)0x0) {
                local_40 = p_Var13;
                lVar14 = N_VGetArrayPointer(local_58);
                if (0 < local_78) {
                  lVar16 = 0;
                  do {
                    iVar1 = rand();
                    *(double *)(lVar14 + lVar16 * 8) = (double)iVar1 / 2147483647.0 + 1.0;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < local_78);
                }
                N_VConst(0x4014000000000000,local_70);
                p_Var15 = (SUNLinearSolver)SUNLinSol_SPFGMR(p_Var12,2,uVar3);
                iVar1 = Test_SUNLinSolGetType(p_Var15,SUNLINEARSOLVER_ITERATIVE,0);
                local_38 = p_Var12;
                iVar4 = Test_SUNLinSolGetID(p_Var15,SUNLINEARSOLVER_SPFGMR,0);
                iVar5 = Test_SUNLinSolSetATimes(p_Var15,&local_78,ATimes,0);
                iVar6 = Test_SUNLinSolSetPreconditioner(p_Var15,&local_78,PSetup,PSolve,0);
                iVar7 = Test_SUNLinSolSetScalingVectors(p_Var15,local_68,local_60,0);
                iVar8 = Test_SUNLinSolSetZeroGuess(p_Var15,0);
                iVar9 = Test_SUNLinSolInitialize(p_Var15,0);
                iVar10 = Test_SUNLinSolSpace(p_Var15,0);
                iVar11 = SUNLinSol_SPFGMRSetGSType(p_Var15,uVar2);
                uVar2 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                if (uVar2 == 0) {
                  local_48 = p_Var15;
                  puts("SUCCESS: SUNLinSol_SPFGMR module passed all initialization tests\n");
                  N_VConst(0x3ff0000000000000,local_68);
                  N_VConst(0x3ff0000000000000,local_60);
                  p_Var13 = local_38;
                  N_VDiv(local_58,local_60,local_38);
                  p_Var12 = local_40;
                  uVar2 = ATimes(&local_78,p_Var13,local_40);
                  p_Var15 = local_48;
                  if (uVar2 != 0) {
                    fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",(ulong)uVar2)
                    ;
                    return 1;
                  }
                  iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                  iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                  iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1,0);
                  iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0,0);
                  iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                  iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                  iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                  iVar10 = Test_SUNLinSolResid(p_Var15,0);
                  uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                  if (uVar2 == 0) {
                    puts("SUCCESS: SUNLinSol_SPFGMR module, problem 1, passed all tests\n");
                  }
                  else {
                    printf("FAIL: SUNLinSol_SPFGMR module, problem 1, failed %i tests\n\n",
                           (ulong)uVar2);
                  }
                  uVar3 = (uint)(uVar2 != 0);
                  N_VConst(0x3ff0000000000000,local_68);
                  N_VConst(0x3ff0000000000000,local_60);
                  N_VDiv(local_58,local_60,p_Var13);
                  p_Var12 = local_40;
                  uVar2 = ATimes(&local_78,p_Var13,local_40);
                  p_Var15 = local_48;
                  if (uVar2 == 0) {
                    iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                    iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                    iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1,0);
                    iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0,0);
                    iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                    iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                    iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                    iVar10 = Test_SUNLinSolResid(p_Var15,0);
                    uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                    if (uVar2 == 0) {
                      puts("SUCCESS: SUNLinSol_SPFGMR module, problem 2, passed all tests\n");
                    }
                    else {
                      printf("FAIL: SUNLinSol_SPFGMR module, problem 2, failed %i tests\n\n",
                             (ulong)uVar2);
                      uVar3 = uVar3 + 1;
                    }
                    lVar14 = N_VGetArrayPointer(local_68);
                    p_Var12 = local_40;
                    if (0 < local_78) {
                      lVar16 = 0;
                      do {
                        iVar1 = rand();
                        *(double *)(lVar14 + lVar16 * 8) =
                             ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                        lVar16 = lVar16 + 1;
                      } while (lVar16 < local_78);
                    }
                    N_VConst(0x3ff0000000000000,local_60);
                    N_VDiv(local_58,local_60,p_Var13);
                    uVar2 = ATimes(&local_78,p_Var13,p_Var12);
                    p_Var15 = local_48;
                    if (uVar2 == 0) {
                      iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                      iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                      iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1,0);
                      iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0,0);
                      iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                      iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                      iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                      iVar10 = Test_SUNLinSolResid(p_Var15,0);
                      uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                      if (uVar2 == 0) {
                        puts("SUCCESS: SUNLinSol_SPFGMR module, problem 3, passed all tests\n");
                      }
                      else {
                        printf("FAIL: SUNLinSol_SPFGMR module, problem 3, failed %i tests\n\n",
                               (ulong)uVar2);
                        uVar3 = uVar3 + 1;
                      }
                      lVar14 = N_VGetArrayPointer(local_68);
                      p_Var12 = local_40;
                      if (0 < local_78) {
                        lVar16 = 0;
                        do {
                          iVar1 = rand();
                          *(double *)(lVar14 + lVar16 * 8) =
                               ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < local_78);
                      }
                      N_VConst(0x3ff0000000000000,local_60);
                      N_VDiv(local_58,local_60,p_Var13);
                      uVar2 = ATimes(&local_78,p_Var13,p_Var12);
                      p_Var15 = local_48;
                      if (uVar2 == 0) {
                        iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                        iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                        iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1,0);
                        iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0,0);
                        iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                        iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                        iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                        iVar10 = Test_SUNLinSolResid(p_Var15,0);
                        uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                        if (uVar2 == 0) {
                          puts("SUCCESS: SUNLinSol_SPFGMR module, problem 4, passed all tests\n");
                        }
                        else {
                          printf("FAIL: SUNLinSol_SPFGMR module, problem 4, failed %i tests\n\n",
                                 (ulong)uVar2);
                          uVar3 = uVar3 + 1;
                        }
                        N_VConst(0x3ff0000000000000,local_68);
                        lVar14 = N_VGetArrayPointer(local_60);
                        p_Var12 = local_40;
                        if (0 < local_78) {
                          lVar16 = 0;
                          do {
                            iVar1 = rand();
                            *(double *)(lVar14 + lVar16 * 8) =
                                 ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                            lVar16 = lVar16 + 1;
                          } while (lVar16 < local_78);
                        }
                        N_VDiv(local_58,local_60,p_Var13);
                        uVar2 = ATimes(&local_78,p_Var13,p_Var12);
                        p_Var15 = local_48;
                        if (uVar2 == 0) {
                          iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                          iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                          iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1,0
                                                     );
                          iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0,0
                                                     );
                          iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                          iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                          iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                          iVar10 = Test_SUNLinSolResid(p_Var15,0);
                          uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                          if (uVar2 == 0) {
                            puts("SUCCESS: SUNLinSol_SPFGMR module, problem 5, passed all tests\n");
                          }
                          else {
                            printf("FAIL: SUNLinSol_SPFGMR module, problem 5, failed %i tests\n\n",
                                   (ulong)uVar2);
                            uVar3 = uVar3 + 1;
                          }
                          N_VConst(0x3ff0000000000000,local_68);
                          lVar14 = N_VGetArrayPointer(local_60);
                          p_Var12 = local_40;
                          if (0 < local_78) {
                            lVar16 = 0;
                            do {
                              iVar1 = rand();
                              *(double *)(lVar14 + lVar16 * 8) =
                                   ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                              lVar16 = lVar16 + 1;
                            } while (lVar16 < local_78);
                          }
                          N_VDiv(local_58,local_60,p_Var13);
                          uVar2 = ATimes(&local_78,p_Var13,p_Var12);
                          p_Var15 = local_48;
                          if (uVar2 == 0) {
                            iVar1 = SUNLinSol_SPFGMRSetPrecType(local_48);
                            iVar4 = Test_SUNLinSolSetup(p_Var15,(SUNMatrix)0x0,0);
                            iVar5 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,1
                                                        ,0);
                            iVar6 = Test_SUNLinSolSolve(p_Var15,(SUNMatrix)0x0,p_Var13,p_Var12,tol,0
                                                        ,0);
                            iVar7 = Test_SUNLinSolLastFlag(p_Var15,0);
                            iVar8 = Test_SUNLinSolNumIters(p_Var15,0);
                            iVar9 = Test_SUNLinSolResNorm(p_Var15,0);
                            iVar10 = Test_SUNLinSolResid(p_Var15,0);
                            uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                            if (uVar2 == 0) {
                              puts("SUCCESS: SUNLinSol_SPFGMR module, problem 6, passed all tests\n"
                                  );
                            }
                            else {
                              printf("FAIL: SUNLinSol_SPFGMR module, problem 6, failed %i tests\n\n"
                                     ,(ulong)uVar2);
                              uVar3 = uVar3 + 1;
                            }
                            SUNLinSolFree(local_48);
                            N_VDestroy(p_Var13);
                            N_VDestroy(local_58);
                            N_VDestroy(local_40);
                            N_VDestroy(local_70);
                            N_VDestroy(local_68);
                            N_VDestroy(local_60);
                            SUNContext_Free(&local_50);
                            return uVar3;
                          }
                        }
                      }
                    }
                  }
                  fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",(ulong)uVar2);
                  return 1;
                }
                printf("FAIL: SUNLinSol_SPFGMR module failed %i initialization tests\n\n",
                       (ulong)uVar2);
                return 1;
              }
              main_cold_1();
              return 1;
            }
            main_cold_3();
            return 1;
          }
          __s = "ERROR: Solver tolerance must be a positive real number";
        }
      }
    }
  }
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int gstype, maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 6)
  {
    printf("ERROR: FIVE (5) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  gstype = atoi(argv[2]);
  if ((gstype < 1) || (gstype > 2))
  {
    printf(
      "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
    return 1;
  }
  maxl = atoi(argv[3]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[4]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[5]);
  SetTiming(print_timing);

  printf("\nSPFGMR linear solver test:\n");
  printf("  problem size = %ld\n", (long int)ProbData.N);
  printf("  Gram-Schmidt orthogonalization type = %i\n", gstype);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s1 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s1, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s2 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s2, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create SPFGMR linear solver */
  LS = SUNLinSol_SPFGMR(x, SUN_PREC_RIGHT, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_SPFGMR, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s1, ProbData.s2, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  fails += SUNLinSol_SPFGMRSetGSType(LS, gstype);
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf(
      "SUCCESS: SUNLinSol_SPFGMR module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 1, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 2, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaled rows (no preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 3, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaled rows (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 4, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 4, passed all tests\n\n");
  }

  /*** Test 5: Poisson-like solve w/ scaled columns (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 5, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 5, passed all tests\n\n");
  }

  /*** Test 6: Poisson-like solve w/ scaled columns (Jacobi preconditioning) ***/

  /* set scaling vector, Jacobi solver vector */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 6, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 6, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s1);
  N_VDestroy(ProbData.s2);
  SUNContext_Free(&sunctx);

  return (passfail);
}